

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::FenceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FenceTestInstance *this)

{
  VkDevice *ppVVar1;
  pointer pQVar2;
  VkPhysicalDevice pVVar3;
  VkDevice device;
  MultiQueues *this_00;
  long *plVar4;
  OperationContext *context;
  long *plVar5;
  VkCommandPool obj;
  Handle<(vk::HandleType)24> HVar6;
  Handle<(vk::HandleType)24> HVar7;
  DeviceInterface *pDVar8;
  VkCommandBuffer_s *commandBuffer;
  VkCommandBuffer_s *commandBuffer_00;
  VkQueueFlags flagsWrite;
  VkQueueFlags flagsRead;
  uint uVar9;
  uint uVar10;
  int iVar11;
  Resource *pRVar12;
  void *__s2;
  long lVar13;
  undefined1 auVar14 [16];
  SyncInfo SVar15;
  ulong local_160;
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  resource;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  long *local_108;
  long local_100;
  long local_f8 [2];
  DeviceInterface *local_e8;
  SyncInfo local_e0;
  SyncInfo local_d0;
  vector<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
  queuePairs;
  VkCommandBuffer cmdBuffers [2];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  
  pVVar3 = (this->super_BaseTestInstance).m_opContext.m_physicalDevice;
  local_e8 = *(DeviceInterface **)(pVVar3 + 8);
  device = *(VkDevice *)(pVVar3 + 0x18);
  this_00 = (MultiQueues *)(this->super_BaseTestInstance).m_opContext.m_vki;
  flagsWrite = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                     super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                     .m_data.ptr + 0x18))();
  plVar4 = *(long **)&(this->super_BaseTestInstance).m_resource.
                      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                      .m_data.field_0x8;
  flagsRead = (**(code **)(*plVar4 + 0x18))
                        (plVar4,(this->super_BaseTestInstance).m_opContext.m_physicalDevice);
  MultiQueues::getQueuesPairs(&queuePairs,this_00,flagsWrite,flagsRead);
  if ((int)((ulong)((long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)queuePairs.
                         super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0) {
    local_160 = 0;
    do {
      pQVar2 = queuePairs.
               super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar12 = (Resource *)operator_new(0x80);
      context = (OperationContext *)(this->super_BaseTestInstance).m_opContext.m_physicalDevice;
      uVar9 = (**(code **)(*(long *)(this->super_BaseTestInstance).m_resource.
                                    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                    .m_data.ptr + 0x10))();
      uVar10 = (**(code **)(**(long **)&(this->super_BaseTestInstance).m_resource.
                                        super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                                        .m_data.field_0x8 + 0x10))();
      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      Resource::Resource(pRVar12,context,
                         (ResourceDescription *)
                         &(this->super_BaseTestInstance).m_opContext.m_allocator,uVar10 | uVar9,
                         VK_SHARING_MODE_EXCLUSIVE,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)cmdPool);
      resource.
      super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      .m_data.ptr = pRVar12;
      if (cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        operator_delete((void *)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                object.m_internal,
                        (long)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                              deleter.m_device -
                        cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      }
      pRVar12 = (this->super_BaseTestInstance).m_resource.
                super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                .m_data.ptr;
      (**(code **)(*(long *)pRVar12 + 0x28))
                (cmdPool,pRVar12,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr);
      HVar6 = cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object;
      plVar4 = *(long **)&(this->super_BaseTestInstance).m_resource.
                          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                          .m_data.field_0x8;
      (**(code **)(*plVar4 + 0x28))
                (cmdPool,plVar4,(this->super_BaseTestInstance).m_opContext.m_physicalDevice,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr);
      pDVar8 = local_e8;
      HVar7 = cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object;
      ::vk::createCommandPool
                (cmdPool,local_e8,device,2,pQVar2[local_160].familyIndexWrite,
                 (VkAllocationCallbacks *)0x0);
      pQVar2 = pQVar2 + local_160;
      ::vk::createCommandPool
                (cmdPool + 1,pDVar8,device,2,pQVar2->familyIndexRead,(VkAllocationCallbacks *)0x0);
      makeCommandBuffer(ptrCmdBuffer,pDVar8,device,
                        (VkCommandPool)
                        cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      makeCommandBuffer(ptrCmdBuffer + 1,pDVar8,device,
                        (VkCommandPool)
                        cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
      commandBuffer_00 = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      commandBuffer = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
      SVar15 = (SyncInfo)(**(code **)(*(long *)HVar6.m_internal + 0x18))();
      local_d0 = SVar15;
      SVar15 = (SyncInfo)(**(code **)(*(long *)HVar7.m_internal + 0x18))(HVar7.m_internal);
      pDVar8 = local_e8;
      local_e0 = SVar15;
      beginCommandBuffer(local_e8,commandBuffer);
      (**(code **)(*(long *)HVar6.m_internal + 0x10))(HVar6.m_internal,commandBuffer);
      createBarrierMultiQueue
                (pDVar8,cmdBuffers,&local_d0,&local_e0,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr,pQVar2->familyIndexWrite,pQVar2->familyIndexRead,
                 *(VkSharingMode *)
                  &(this->super_BaseTestInstance).m_writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.ptr,false);
      endCommandBuffer(pDVar8,commandBuffer);
      submitCommandsAndWait(pDVar8,device,pQVar2->queueWrite,commandBuffer);
      beginCommandBuffer(pDVar8,commandBuffer_00);
      createBarrierMultiQueue
                (pDVar8,cmdBuffers + 1,&local_d0,&local_e0,
                 resource.
                 super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                 .m_data.ptr,pQVar2->familyIndexWrite,pQVar2->familyIndexRead,
                 *(VkSharingMode *)
                  &(this->super_BaseTestInstance).m_writeOp.
                   super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                   .m_data.ptr,true);
      (**(code **)(*(long *)HVar7.m_internal + 0x10))(HVar7.m_internal,commandBuffer_00);
      endCommandBuffer(pDVar8,commandBuffer_00);
      submitCommandsAndWait(pDVar8,device,pQVar2->queueRead,commandBuffer_00);
      auVar14 = (**(code **)(*(long *)HVar6.m_internal + 0x20))(HVar6.m_internal);
      (**(code **)(*(long *)HVar7.m_internal + 0x20))(HVar7.m_internal);
      iVar11 = bcmp(auVar14._8_8_,__s2,auVar14._0_8_);
      if (iVar11 != 0) {
        local_108 = local_f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Memory contents don\'t match","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_108,
                   local_100 + (long)local_108);
        if (local_108 != local_f8) {
          operator_delete(local_108,local_f8[0] + 1);
        }
      }
      lVar13 = 0x20;
      do {
        plVar4 = *(long **)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                   object + lVar13);
        if (plVar4 != (long *)0x0) {
          plVar5 = *(long **)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                     deleter.m_deviceIface + lVar13);
          local_108 = plVar4;
          (**(code **)(*plVar5 + 0x240))
                    (plVar5,*(undefined8 *)
                             ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                     deleter.m_device + lVar13),
                     *(undefined8 *)
                      ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                              m_pool.m_internal + lVar13),1);
        }
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device +
         lVar13) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                 m_internal + lVar13) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar13) = 0;
        *(undefined8 *)
         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
         + lVar13) = 0;
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != -0x20);
      lVar13 = 0;
      do {
        obj.m_internal =
             *(deUint64 *)
              ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal + lVar13);
        if (obj.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
                     ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                             deleter.m_deviceIface + lVar13),obj);
        }
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device +
         lVar13) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_allocator + lVar13) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
         + lVar13) = 0;
        *(undefined8 *)
         ((long)&cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_deviceIface + lVar13) = 0;
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != -0x40);
      (**(code **)(*(long *)HVar7.m_internal + 8))(HVar7.m_internal);
      (**(code **)(*(long *)HVar6.m_internal + 8))(HVar6.m_internal);
      de::details::
      UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
      ::reset(&resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
             );
      if (iVar11 != 0) goto LAB_007d2708;
      local_160 = local_160 + 1;
    } while (local_160 <
             (uint)((int)((ulong)((long)queuePairs.
                                        super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)queuePairs.
                                       super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555));
  }
  ppVVar1 = &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)cmdPool,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             (long)&(cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                    m_deviceIface)->_vptr_DeviceInterface +
             cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  if ((VkDevice *)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
      != ppVVar1) {
    operator_delete((void *)cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                            m_internal,
                    (ulong)(cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter
                            .m_device + 1));
  }
LAB_007d2708:
  if (queuePairs.
      super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(queuePairs.
                    super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)queuePairs.
                          super__Vector_base<vkt::synchronization::(anonymous_namespace)::QueuePair,_std::allocator<vkt::synchronization::(anonymous_namespace)::QueuePair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate (void)
	{
		enum {WRITE=0, READ, COUNT};
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
		VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[WRITE], *ptrCmdBuffer[READ]};
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, cmdBuffers[WRITE]);

		m_writeOp->recordCommands(cmdBuffers[WRITE]);

		if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffers[WRITE],  writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}

		endCommandBuffer(vk, cmdBuffers[WRITE]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[WRITE]);

		beginCommandBuffer(vk, cmdBuffers[READ]);

		m_readOp->recordCommands(cmdBuffers[READ]);

		endCommandBuffer(vk, cmdBuffers[READ]);

		submitCommandsAndWait(vk, device, queue, cmdBuffers[READ]);

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}